

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O0

void anon_unknown.dwarf_1a22cd::SetMapValue(t_StringToString *map,string *op,cmValue value)

{
  bool bVar1;
  string *psVar2;
  mapped_type *this;
  string *op_local;
  t_StringToString *map_local;
  cmValue value_local;
  
  map_local = (t_StringToString *)value.Value;
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&map_local);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)&map_local);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](map,op);
    std::__cxx11::string::operator=((string *)this,(string *)psVar2);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(map,op);
  }
  return;
}

Assistant:

void SetMapValue(cmCTestGenericHandler::t_StringToString& map,
                 const std::string& op, cmValue value)
{
  if (!value) {
    map.erase(op);
    return;
  }

  map[op] = *value;
}